

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O2

void gimage::rgbToHSV<float,gimage::PixelTraits<float>>
               (ImageFloat *ret,Image<float,_gimage::PixelTraits<float>_> *image)

{
  float ***pppfVar1;
  long k;
  long lVar2;
  long i;
  long lVar3;
  float val;
  float sat;
  float hue;
  
  Image<float,_gimage::PixelTraits<float>_>::setSize(ret,image->width,image->height,3);
  for (lVar2 = 0; lVar2 < image->height; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 < image->width; lVar3 = lVar3 + 1) {
      pppfVar1 = image->img;
      rgbToHSV<float>(&hue,&sat,&val,(*pppfVar1)[lVar2][lVar3],pppfVar1[1][lVar2][lVar3],
                      pppfVar1[2][lVar2][lVar3],3.4028235e+38);
      pppfVar1 = ret->img;
      (*pppfVar1)[lVar2][lVar3] = hue;
      pppfVar1[1][lVar2][lVar3] = sat;
      pppfVar1[2][lVar2][lVar3] = val;
    }
  }
  return;
}

Assistant:

void rgbToHSV(ImageFloat &ret, const Image<T, traits> &image)
{
  float hue, sat, val;

  assert(image.getDepth() == 3);

  ret.setSize(image.getWidth(), image.getHeight(), 3);

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      rgbToHSV(hue, sat, val, image.getW(i, k, 0), image.getW(i, k, 1),
               image.getW(i, k, 2), image.absMaxValue());

      ret.setLimited(i, k, 0, hue);
      ret.setLimited(i, k, 1, sat);
      ret.setLimited(i, k, 2, val);
    }
  }
}